

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::UnixSocket::~UnixSocket(UnixSocket *this)

{
  Shutdown(this,true);
  WeakPtrFactory<perfetto::base::UnixSocket>::~WeakPtrFactory(&this->weak_ptr_factory_);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource((ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
                     *)this);
  return;
}

Assistant:

UnixSocket::~UnixSocket() {
  // The implicit dtor of |weak_ptr_factory_| will no-op pending callbacks.
  Shutdown(true);
}